

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  LogManager *this;
  reference pvVar1;
  pointer this_00;
  RequestBuilder *pRVar2;
  anon_class_1_0_00000001 local_119;
  completion_fn_t local_118;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_f8 [2];
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [16];
  Client client;
  int local_84;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_60;
  undefined1 local_50 [8];
  json j;
  unique_ptr<logfault::StreamHandler,_std::default_delete<logfault::StreamHandler>_> local_28;
  unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_> local_20;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  this = logfault::LogManager::Instance();
  std::make_unique<logfault::StreamHandler,std::ostream&,logfault::LogLevel>
            ((basic_ostream<char,_std::char_traits<char>_> *)&local_28,(LogLevel *)&std::clog);
  std::unique_ptr<logfault::Handler,std::default_delete<logfault::Handler>>::
  unique_ptr<logfault::StreamHandler,std::default_delete<logfault::StreamHandler>,void>
            ((unique_ptr<logfault::Handler,std::default_delete<logfault::Handler>> *)&local_20,
             &local_28);
  logfault::LogManager::AddHandler(this,(ptr_t *)&local_20);
  std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<logfault::StreamHandler,_std::default_delete<logfault::StreamHandler>_>::
  ~unique_ptr(&local_28);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_50,(nullptr_t)0x0);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_char_(&)[9],_char[9],_0>(&local_60,(char (*) [9])"Dolphins");
  pvVar1 = nlohmann::json_abi_v3_12_0::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_50,"title");
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar1,&local_60);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&local_60);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_char_(&)[24],_char[24],_0>(&local_70,(char (*) [24])"Thanks for all the fish");
  pvVar1 = nlohmann::json_abi_v3_12_0::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_50,"body");
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar1,&local_70);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&local_70);
  local_84 = 0x2a;
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<int,_int,_0>(&local_80,&local_84);
  pvVar1 = nlohmann::json_abi_v3_12_0::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_50,"answer");
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar1,&local_80);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&local_80);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_char_(&)[25],_char[25],_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&client.worker_,(char (*) [25])"Unknown in this universe");
  pvVar1 = nlohmann::json_abi_v3_12_0::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_12_0::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_50,"interperation");
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar1,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&client.worker_);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&client.worker_);
  restincurl::Client::Client((Client *)(local_b0 + 8),true);
  restincurl::Client::Build((Client *)local_b0);
  this_00 = std::
            unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
            ::operator->((unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
                          *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"http://jsonplaceholder.typicode.com/posts",&local_d1);
  pRVar2 = restincurl::RequestBuilder::Post(this_00,(string *)local_d0);
  pRVar2 = restincurl::RequestBuilder::AcceptJson(pRVar2);
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(local_f8,(int)local_50,-1,true,strict);
  pRVar2 = restincurl::RequestBuilder::WithJson(pRVar2,(string *)local_f8);
  std::function<void(restincurl::Result_const&)>::function<main::__0,void>
            ((function<void(restincurl::Result_const&)> *)&local_118,&local_119);
  pRVar2 = restincurl::RequestBuilder::WithCompletion(pRVar2,&local_118);
  restincurl::RequestBuilder::Execute(pRVar2);
  std::function<void_(const_restincurl::Result_&)>::~function(&local_118);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>::
  ~unique_ptr((unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
               *)local_b0);
  restincurl::Client::CloseWhenFinished((Client *)(local_b0 + 8));
  restincurl::Client::WaitForFinish((Client *)(local_b0 + 8));
  restincurl::Client::~Client((Client *)(local_b0 + 8));
  nlohmann::json_abi_v3_12_0::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)local_50);
  return 0;
}

Assistant:

int main( int argc, char * argv[]) {

     // Use logfault for logging and log to std::clog on DEBUG level
    LogManager::Instance().AddHandler(
        make_unique<StreamHandler>(clog, logfault::LogLevel::DEBUGGING));

    // Create some data
    json j;
    j["title"] = "Dolphins";
    j["body"] = "Thanks for all the fish";
    j["answer"] = 42;
    j["interperation"] = "Unknown in this universe";
    
    Client client;
    client.Build()->Post("http://jsonplaceholder.typicode.com/posts")
    
        // Tell the server that we accept Json payloads
        .AcceptJson()
        
        // Tell the server that we have a Json body, and 
        // hand that body to the request.
        // json::dump() will serialize the data in j as a Json string.
        .WithJson(j.dump())
        
        // Call this lambda when the request is done
        .WithCompletion([&](const Result& result) {
            
            // Check if the request was successful
            if (result.isOk()) {
                LFLOG_DEBUG << "Returned body was " << result.body;
                try {
                    
                    // Parse the response body we got as Json.
                    const auto j = json::parse(result.body);
                    
                    // We expect to get an id for the object we just sent
                    LFLOG_DEBUG << "The object was assigned id " << j["id"].get<int>();
                    
                } catch (const std::exception& ex) {
                    LFLOG_ERROR << "Caught exception: " << ex.what();
                    return;
                }
                
            } else {
                LFLOG_ERROR << "Request failed: " << result.msg << endl
                    << "HTTP code: " << result.http_response_code << endl;
            }
        })
        .Execute();

        
    client.CloseWhenFinished();
    client.WaitForFinish();
    
    // Done
}